

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O3

bool tinyobj::exportGroupsToShape
               (shape_t *shape,PrimGroup *prim_group,
               vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *tags,int material_id,
               string *name,bool triangulate,vector<float,_std::allocator<float>_> *v)

{
  mesh_t *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_02;
  long lVar1;
  pointer *ppiVar2;
  pointer *ppuVar3;
  pointer __args;
  int iVar4;
  pointer pfVar5;
  undefined8 uVar6;
  iterator iVar7;
  iterator iVar8;
  iterator iVar9;
  bool bVar10;
  pointer pfVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  pointer pvVar15;
  pointer pvVar16;
  pointer p_Var17;
  pointer p_Var18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  size_t i;
  long lVar23;
  ulong uVar24;
  iterator iVar25;
  int *piVar26;
  ulong uVar27;
  pointer p_Var28;
  undefined8 *puVar29;
  size_t k;
  ulong uVar30;
  long lVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  real_t rVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  face_t remainingFace;
  real_t vy [3];
  float local_c4 [2];
  real_t vx [3];
  undefined1 auStack_a8 [8];
  vertex_index_t ind [3];
  undefined1 local_7c [8];
  index_t idx0;
  index_t idx1;
  index_t idx2;
  int local_38;
  uchar local_31;
  int material_id_local;
  
  if ((((prim_group->faceGroup).
        super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (prim_group->faceGroup).
        super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
        super__Vector_impl_data._M_finish) &&
      ((prim_group->lineGroup).
       super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (prim_group->lineGroup).
       super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
       super__Vector_impl_data._M_finish)) &&
     ((prim_group->pointsGroup).
      super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (prim_group->pointsGroup).
      super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    bVar10 = false;
  }
  else {
    local_38 = material_id;
    std::__cxx11::string::_M_assign((string *)shape);
    pfVar11 = (prim_group->faceGroup).
              super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pfVar11 !=
        (prim_group->faceGroup).
        super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      this = &shape->mesh;
      this_00 = &(shape->mesh).num_face_vertices;
      this_01 = &(shape->mesh).material_ids;
      this_02 = &(shape->mesh).smoothing_group_ids;
      uVar21 = 0;
      do {
        pvVar15 = pfVar11[uVar21].vertex_indices.
                  super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar23 = (long)pfVar11[uVar21].vertex_indices.
                       super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar15 >> 2;
        uVar24 = lVar23 * -0x5555555555555555;
        if (2 < uVar24) {
          __args = pfVar11 + uVar21;
          vx._4_8_ = uVar21;
          if (triangulate) {
            pfVar5 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar27 = (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)pfVar5 >> 2;
            lVar23 = lVar23 * 0x5555555555555555;
            uVar14 = 1;
            pvVar16 = pvVar15;
            do {
              lVar31 = (long)pvVar16->v_idx;
              if (lVar31 * 3 + 2U < uVar27) {
                uVar12 = lVar23 + uVar14;
                if (lVar23 + uVar14 != 0) {
                  uVar12 = uVar14;
                }
                lVar13 = (long)pvVar15[uVar12].v_idx;
                if ((lVar13 * 3 + 2U < uVar27) &&
                   (lVar19 = (long)pvVar15[(uVar14 + 1) % uVar24].v_idx, lVar19 * 3 + 2U < uVar27))
                {
                  fVar38 = pfVar5[lVar19 * 3] - pfVar5[lVar13 * 3];
                  fVar37 = pfVar5[lVar13 * 3] - pfVar5[lVar31 * 3];
                  fVar33 = pfVar5[lVar19 * 3 + 1] - pfVar5[lVar13 * 3 + 1];
                  fVar35 = pfVar5[lVar13 * 3 + 1] - pfVar5[lVar31 * 3 + 1];
                  fVar39 = pfVar5[lVar19 * 3 + 2] - pfVar5[lVar13 * 3 + 2];
                  fVar32 = pfVar5[lVar13 * 3 + 2] - pfVar5[lVar31 * 3 + 2];
                  fVar34 = ABS(fVar35 * fVar39 - fVar33 * fVar32);
                  fVar32 = ABS(fVar32 * fVar38 - fVar39 * fVar37);
                  fVar33 = ABS(fVar33 * fVar37 - fVar35 * fVar38);
                  if ((1.1920929e-07 < fVar33) ||
                     ((1.1920929e-07 < fVar34 || (1.1920929e-07 < fVar32)))) {
                    if ((fVar34 <= fVar33) || (fVar34 <= fVar32)) {
                      lVar31 = 2 - (ulong)(-(uint)(fVar34 < fVar33 && fVar32 < fVar33) & 1);
                      lVar13 = 0;
                      goto LAB_00116fb5;
                    }
                    break;
                  }
                }
              }
              lVar31 = lVar23 + uVar14;
              pvVar16 = pvVar16 + 1;
              uVar14 = uVar14 + 1;
            } while (lVar31 != 0);
            lVar31 = 2;
            lVar13 = 1;
LAB_00116fb5:
            fVar32 = 0.0;
            uVar14 = 1;
            pvVar16 = pvVar15;
            do {
              uVar12 = 0;
              if (uVar14 != uVar24) {
                uVar12 = uVar14;
              }
              lVar19 = (long)pvVar16->v_idx * 3;
              uVar22 = lVar19 + lVar13;
              if ((uVar22 < uVar27) && (uVar20 = lVar19 + lVar31, uVar20 < uVar27)) {
                lVar19 = (long)pvVar15[uVar12].v_idx * 3;
                uVar12 = lVar19 + lVar13;
                if ((uVar12 < uVar27) && (uVar30 = lVar19 + lVar31, uVar30 < uVar27)) {
                  fVar32 = fVar32 + (pfVar5[uVar22] * pfVar5[uVar30] -
                                    pfVar5[uVar12] * pfVar5[uVar20]) * 0.5;
                }
              }
              lVar19 = lVar23 + uVar14;
              uVar14 = uVar14 + 1;
              pvVar16 = pvVar16 + 1;
            } while (lVar19 != 0);
            std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::vector
                      ((vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_> *)
                       &remainingFace,&pfVar11[uVar21].vertex_indices);
            ind[0].vn_idx = -1;
            ind[1].v_idx = -1;
            ind[1].vt_idx = -1;
            ind[1].vn_idx = -1;
            auStack_a8._0_4_ = -1;
            auStack_a8._4_4_ = -1;
            ind[0].v_idx = -1;
            ind[0].vt_idx = -1;
            ind[2].v_idx = -1;
            lVar23 = (long)remainingFace.vertex_indices.
                           super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                           ._M_impl.super__Vector_impl_data._M_start - remainingFace._0_8_;
            uVar21 = (lVar23 >> 2) * -0x5555555555555555;
            piVar26 = (int *)remainingFace._0_8_;
            if ((3 < uVar21) &&
               (lVar19 = (long)(__args->vertex_indices).
                               super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(__args->vertex_indices).
                               super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                               ._M_impl.super__Vector_impl_data._M_start, lVar19 != 0)) {
              uVar24 = (lVar19 >> 2) * -0x5555555555555555;
              uVar27 = 0;
              pvVar15 = remainingFace.vertex_indices.
                        super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar14 = uVar21;
              do {
                uVar12 = uVar21;
                uVar21 = uVar12;
                if (uVar27 < uVar12) {
                  uVar21 = 0;
                }
                uVar27 = uVar27 - uVar21;
                pfVar5 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                uVar21 = (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pfVar5 >> 2;
                puVar29 = (undefined8 *)auStack_a8;
                lVar23 = 0;
                do {
                  uVar22 = (uVar27 + lVar23) % uVar12;
                  *(int *)(puVar29 + 1) = piVar26[uVar22 * 3 + 2];
                  uVar6 = *(undefined8 *)(piVar26 + uVar22 * 3);
                  *puVar29 = uVar6;
                  iVar4 = ind[1].vn_idx;
                  lVar19 = (long)(int)uVar6 * 3;
                  uVar22 = lVar19 + lVar13;
                  if ((uVar22 < uVar21) && (uVar20 = lVar19 + lVar31, uVar20 < uVar21)) {
                    local_c4[lVar23] = pfVar5[uVar22];
                    rVar36 = pfVar5[uVar20];
                  }
                  else {
                    local_c4[lVar23] = 0.0;
                    rVar36 = 0.0;
                  }
                  vy[lVar23 + -2] = rVar36;
                  lVar23 = lVar23 + 1;
                  puVar29 = (undefined8 *)((long)puVar29 + 0xc);
                } while (lVar23 != 3);
                uVar24 = uVar24 - 1;
                if (uVar14 != uVar12) {
                  uVar24 = uVar12;
                }
                if (0.0 <= ((vy[0] - remainingFace.vertex_indices.
                                     super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                            (local_c4[1] - local_c4[0]) -
                           (vx[0] - local_c4[1]) *
                           (remainingFace.vertex_indices.
                            super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ -
                           remainingFace.vertex_indices.
                           super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_)) * fVar32) {
                  if (3 < uVar12) {
                    uVar14 = 3;
                    do {
                      uVar22 = (long)piVar26[((uVar14 + uVar27) % uVar12) * 3] * 3 + lVar13;
                      if ((uVar22 < uVar21) &&
                         (uVar20 = (long)piVar26[((uVar14 + uVar27) % uVar12) * 3] * 3 + lVar31,
                         uVar20 < uVar21)) {
                        fVar33 = pfVar5[uVar20];
                        bVar10 = false;
                        lVar23 = 2;
                        lVar19 = 0;
                        rVar36 = vy[0];
                        do {
                          fVar34 = vy[lVar19 + -2];
                          if ((fVar33 < fVar34 == rVar36 <= fVar33) &&
                             (pfVar5[uVar22] <
                              ((fVar33 - fVar34) * (local_c4[lVar23] - local_c4[lVar19])) /
                              (rVar36 - fVar34) + local_c4[lVar19])) {
                            bVar10 = !bVar10;
                          }
                          lVar1 = lVar19 + 1;
                          lVar23 = lVar19;
                          lVar19 = lVar1;
                          rVar36 = fVar34;
                        } while (lVar1 != 3);
                        if (bVar10) goto LAB_001171fc;
                      }
                      uVar14 = uVar14 + 1;
                    } while (uVar14 != uVar12);
                  }
                  local_7c._0_4_ = auStack_a8._0_4_;
                  local_7c._4_4_ = ind[0].v_idx;
                  idx0.vertex_index = auStack_a8._4_4_;
                  idx0.normal_index = ind[0].vt_idx;
                  idx0.texcoord_index = ind[1].v_idx;
                  idx1.vertex_index = ind[0].vn_idx;
                  idx1.normal_index = ind[1].vt_idx;
                  idx1.texcoord_index = ind[2].v_idx;
                  iVar25._M_current =
                       (shape->mesh).indices.
                       super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar25._M_current ==
                      (shape->mesh).indices.
                      super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                    _M_realloc_insert<tinyobj::index_t_const&>
                              ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)this,
                               iVar25,(index_t *)local_7c);
                    iVar25._M_current =
                         (shape->mesh).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                  }
                  else {
                    (iVar25._M_current)->texcoord_index = auStack_a8._4_4_;
                    (iVar25._M_current)->vertex_index = auStack_a8._0_4_;
                    (iVar25._M_current)->normal_index = ind[0].v_idx;
                    iVar25._M_current =
                         (shape->mesh).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish + 1;
                    (shape->mesh).indices.
                    super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                    super__Vector_impl_data._M_finish = iVar25._M_current;
                  }
                  if (iVar25._M_current ==
                      (shape->mesh).indices.
                      super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                    _M_realloc_insert<tinyobj::index_t_const&>
                              ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)this,
                               iVar25,(index_t *)&idx0.normal_index);
                    iVar25._M_current =
                         (shape->mesh).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                  }
                  else {
                    (iVar25._M_current)->texcoord_index = idx1.vertex_index;
                    (iVar25._M_current)->vertex_index = idx0.normal_index;
                    (iVar25._M_current)->normal_index = idx0.texcoord_index;
                    iVar25._M_current =
                         (shape->mesh).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish + 1;
                    (shape->mesh).indices.
                    super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                    super__Vector_impl_data._M_finish = iVar25._M_current;
                  }
                  if (iVar25._M_current ==
                      (shape->mesh).indices.
                      super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                    _M_realloc_insert<tinyobj::index_t_const&>
                              ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)this,
                               iVar25,(index_t *)&idx1.normal_index);
                  }
                  else {
                    (iVar25._M_current)->texcoord_index = iVar4;
                    (iVar25._M_current)->vertex_index = idx1.normal_index;
                    (iVar25._M_current)->normal_index = idx1.texcoord_index;
                    ppiVar2 = &(shape->mesh).indices.
                               super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppiVar2 = *ppiVar2 + 1;
                  }
                  local_31 = '\x03';
                  iVar7._M_current =
                       (shape->mesh).num_face_vertices.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar7._M_current ==
                      (shape->mesh).num_face_vertices.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                    _M_realloc_insert<unsigned_char>(this_00,iVar7,&local_31);
                  }
                  else {
                    *iVar7._M_current = '\x03';
                    ppuVar3 = &(shape->mesh).num_face_vertices.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                    *ppuVar3 = *ppuVar3 + 1;
                  }
                  iVar8._M_current =
                       (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar8._M_current ==
                      (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)this_01,iVar8,&local_38);
                  }
                  else {
                    *iVar8._M_current = local_38;
                    (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_finish = iVar8._M_current + 1;
                  }
                  iVar9._M_current =
                       (shape->mesh).smoothing_group_ids.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar9._M_current ==
                      (shape->mesh).smoothing_group_ids.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_int,std::allocator<unsigned_int>>::
                    _M_realloc_insert<unsigned_int_const&>
                              ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_02,iVar9,
                               &__args->smoothing_group_id);
                  }
                  else {
                    *iVar9._M_current = __args->smoothing_group_id;
                    (shape->mesh).smoothing_group_ids.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish = iVar9._M_current + 1;
                  }
                  uVar21 = (uVar27 + 1) % uVar12;
                  while (uVar14 = uVar21 + 1, uVar14 < uVar12) {
                    *(undefined4 *)(remainingFace._0_8_ + 8 + uVar21 * 0xc) =
                         *(undefined4 *)(remainingFace._0_8_ + 8 + uVar14 * 0xc);
                    *(undefined8 *)(remainingFace._0_8_ + uVar21 * 0xc) =
                         *(undefined8 *)(remainingFace._0_8_ + uVar14 * 0xc);
                    uVar21 = uVar14;
                  }
                  pvVar15 = remainingFace.vertex_indices.
                            super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                            ._M_impl.super__Vector_impl_data._M_start + -1;
                  piVar26 = (int *)remainingFace._0_8_;
                  remainingFace.vertex_indices.
                  super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                  ._M_impl.super__Vector_impl_data._M_start = pvVar15;
                }
                else {
LAB_001171fc:
                  uVar27 = uVar27 + 1;
                }
                lVar23 = (long)pvVar15 - (long)piVar26;
                uVar21 = (lVar23 >> 2) * -0x5555555555555555;
              } while ((3 < uVar21) && (uVar14 = uVar12, uVar24 != 0));
            }
            uVar21 = vx._4_8_;
            if (lVar23 == 0x24) {
              local_7c._0_4_ = *piVar26;
              idx0.vertex_index = piVar26[1];
              local_7c._4_4_ = piVar26[2];
              idx0.normal_index = piVar26[3];
              idx1.vertex_index = piVar26[4];
              idx0.texcoord_index = piVar26[5];
              idx1.normal_index = piVar26[6];
              iVar4 = piVar26[7];
              idx1.texcoord_index = piVar26[8];
              iVar25._M_current =
                   (shape->mesh).indices.
                   super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar25._M_current ==
                  (shape->mesh).indices.
                  super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                _M_realloc_insert<tinyobj::index_t_const&>
                          ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)this,iVar25,
                           (index_t *)local_7c);
                iVar25._M_current =
                     (shape->mesh).indices.
                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
                     .super__Vector_impl_data._M_finish;
              }
              else {
                (iVar25._M_current)->texcoord_index = idx0.vertex_index;
                (iVar25._M_current)->vertex_index = local_7c._0_4_;
                (iVar25._M_current)->normal_index = local_7c._4_4_;
                iVar25._M_current =
                     (shape->mesh).indices.
                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
                     .super__Vector_impl_data._M_finish + 1;
                (shape->mesh).indices.
                super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar25._M_current;
              }
              if (iVar25._M_current ==
                  (shape->mesh).indices.
                  super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                _M_realloc_insert<tinyobj::index_t_const&>
                          ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)this,iVar25,
                           (index_t *)&idx0.normal_index);
                iVar25._M_current =
                     (shape->mesh).indices.
                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
                     .super__Vector_impl_data._M_finish;
              }
              else {
                (iVar25._M_current)->texcoord_index = idx1.vertex_index;
                (iVar25._M_current)->vertex_index = idx0.normal_index;
                (iVar25._M_current)->normal_index = idx0.texcoord_index;
                iVar25._M_current =
                     (shape->mesh).indices.
                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
                     .super__Vector_impl_data._M_finish + 1;
                (shape->mesh).indices.
                super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar25._M_current;
              }
              if (iVar25._M_current ==
                  (shape->mesh).indices.
                  super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                _M_realloc_insert<tinyobj::index_t_const&>
                          ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)this,iVar25,
                           (index_t *)&idx1.normal_index);
              }
              else {
                (iVar25._M_current)->texcoord_index = iVar4;
                (iVar25._M_current)->vertex_index = idx1.normal_index;
                (iVar25._M_current)->normal_index = idx1.texcoord_index;
                ppiVar2 = &(shape->mesh).indices.
                           super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
                *ppiVar2 = *ppiVar2 + 1;
              }
              local_31 = '\x03';
              iVar7._M_current =
                   (shape->mesh).num_face_vertices.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar7._M_current ==
                  (shape->mesh).num_face_vertices.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                _M_realloc_insert<unsigned_char>(this_00,iVar7,&local_31);
              }
              else {
                *iVar7._M_current = '\x03';
                ppuVar3 = &(shape->mesh).num_face_vertices.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish;
                *ppuVar3 = *ppuVar3 + 1;
              }
              iVar8._M_current =
                   (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar8._M_current ==
                  (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)this_01,iVar8,&local_38);
              }
              else {
                *iVar8._M_current = local_38;
                (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar8._M_current + 1;
              }
              iVar9._M_current =
                   (shape->mesh).smoothing_group_ids.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar9._M_current ==
                  (shape->mesh).smoothing_group_ids.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_02,iVar9,
                           &__args->smoothing_group_id);
                piVar26 = (int *)remainingFace._0_8_;
              }
              else {
                *iVar9._M_current = __args->smoothing_group_id;
                (shape->mesh).smoothing_group_ids.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar9._M_current + 1;
                piVar26 = (int *)remainingFace._0_8_;
              }
            }
            if (piVar26 != (int *)0x0) {
              operator_delete(piVar26,(long)remainingFace.vertex_indices.
                                            super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)piVar26);
            }
          }
          else {
            lVar23 = 8;
            uVar14 = uVar24;
            do {
              pvVar15 = pfVar11[uVar21].vertex_indices.
                        super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              auStack_a8._0_4_ = *(int *)((long)pvVar15 + lVar23 + -8);
              auStack_a8._4_4_ = *(int *)((long)&pvVar15->v_idx + lVar23);
              ind[0].v_idx = *(int *)((long)pvVar15 + lVar23 + -4);
              iVar25._M_current =
                   (shape->mesh).indices.
                   super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar25._M_current ==
                  (shape->mesh).indices.
                  super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                _M_realloc_insert<tinyobj::index_t_const&>
                          ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)this,iVar25,
                           (index_t *)auStack_a8);
              }
              else {
                (iVar25._M_current)->texcoord_index = ind[0].v_idx;
                (iVar25._M_current)->vertex_index = auStack_a8._0_4_;
                (iVar25._M_current)->normal_index = auStack_a8._4_4_;
                ppiVar2 = &(shape->mesh).indices.
                           super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
                *ppiVar2 = *ppiVar2 + 1;
              }
              lVar23 = lVar23 + 0xc;
              uVar14 = uVar14 - 1;
            } while (uVar14 != 0);
            auStack_a8[0] = (uchar)uVar24;
            iVar7._M_current =
                 (shape->mesh).num_face_vertices.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar7._M_current ==
                (shape->mesh).num_face_vertices.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              _M_realloc_insert<unsigned_char>(this_00,iVar7,auStack_a8);
            }
            else {
              *iVar7._M_current = (uchar)uVar24;
              ppuVar3 = &(shape->mesh).num_face_vertices.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar3 = *ppuVar3 + 1;
            }
            uVar21 = vx._4_8_;
            iVar8._M_current =
                 (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar8._M_current ==
                (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)this_01,iVar8,&local_38);
            }
            else {
              *iVar8._M_current = local_38;
              (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar8._M_current + 1;
            }
            iVar9._M_current =
                 (shape->mesh).smoothing_group_ids.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar9._M_current ==
                (shape->mesh).smoothing_group_ids.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_02,iVar9,
                         &__args->smoothing_group_id);
            }
            else {
              *iVar9._M_current = __args->smoothing_group_id;
              (shape->mesh).smoothing_group_ids.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar9._M_current + 1;
            }
          }
        }
        uVar21 = uVar21 + 1;
        pfVar11 = (prim_group->faceGroup).
                  super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar21 < (ulong)((long)(prim_group->faceGroup).
                                      super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar11 >>
                               5));
      std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::operator=
                (&(shape->mesh).tags,tags);
    }
    p_Var17 = (prim_group->lineGroup).
              super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (p_Var17 !=
        (prim_group->lineGroup).
        super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar21 = 0;
      do {
        pvVar15 = p_Var17[uVar21].vertex_indices.
                  super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (p_Var17[uVar21].vertex_indices.
            super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>.
            _M_impl.super__Vector_impl_data._M_finish == pvVar15) {
          uVar24 = 0;
        }
        else {
          lVar23 = 8;
          uVar14 = 0;
          do {
            auStack_a8._0_4_ = *(int *)((long)pvVar15 + lVar23 + -8);
            auStack_a8._4_4_ = *(int *)((long)&pvVar15->v_idx + lVar23);
            ind[0].v_idx = *(int *)((long)pvVar15 + lVar23 + -4);
            iVar25._M_current =
                 (shape->lines).indices.
                 super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar25._M_current ==
                (shape->lines).indices.
                super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
              _M_realloc_insert<tinyobj::index_t_const&>
                        ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)&shape->lines,
                         iVar25,(index_t *)auStack_a8);
            }
            else {
              (iVar25._M_current)->texcoord_index = ind[0].v_idx;
              (iVar25._M_current)->vertex_index = auStack_a8._0_4_;
              (iVar25._M_current)->normal_index = auStack_a8._4_4_;
              ppiVar2 = &(shape->lines).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppiVar2 = *ppiVar2 + 1;
            }
            uVar14 = uVar14 + 1;
            p_Var17 = (prim_group->lineGroup).
                      super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pvVar15 = *(pointer *)
                       &p_Var17[uVar21].vertex_indices.
                        super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                        ._M_impl;
            uVar24 = ((long)*(pointer *)
                             ((long)&p_Var17[uVar21].vertex_indices.
                                     super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                     ._M_impl + 8) - (long)pvVar15 >> 2) * -0x5555555555555555;
            lVar23 = lVar23 + 0xc;
          } while (uVar14 < uVar24);
        }
        auStack_a8._0_4_ = (undefined4)uVar24;
        iVar8._M_current =
             (shape->lines).num_line_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (shape->lines).num_line_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&(shape->lines).num_line_vertices,iVar8,(int *)auStack_a8);
        }
        else {
          *iVar8._M_current = auStack_a8._0_4_;
          (shape->lines).num_line_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar8._M_current + 1;
        }
        uVar21 = uVar21 + 1;
        p_Var17 = (prim_group->lineGroup).
                  super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar21 < (ulong)(((long)(prim_group->lineGroup).
                                       super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)p_Var17 >>
                                3) * -0x5555555555555555));
    }
    p_Var28 = (prim_group->pointsGroup).
              super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
              super__Vector_impl_data._M_start;
    p_Var18 = (prim_group->pointsGroup).
              super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
              super__Vector_impl_data._M_finish;
    bVar10 = true;
    if (p_Var28 != p_Var18) {
      uVar21 = 0;
      do {
        pvVar15 = p_Var28[uVar21].vertex_indices.
                  super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (p_Var28[uVar21].vertex_indices.
            super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>.
            _M_impl.super__Vector_impl_data._M_finish != pvVar15) {
          lVar23 = 8;
          uVar24 = 0;
          do {
            auStack_a8._0_4_ = *(int *)((long)pvVar15 + lVar23 + -8);
            auStack_a8._4_4_ = *(int *)((long)&pvVar15->v_idx + lVar23);
            ind[0].v_idx = *(int *)((long)pvVar15 + lVar23 + -4);
            iVar25._M_current =
                 (shape->points).indices.
                 super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar25._M_current ==
                (shape->points).indices.
                super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
              _M_realloc_insert<tinyobj::index_t_const&>
                        ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)&shape->points
                         ,iVar25,(index_t *)auStack_a8);
            }
            else {
              (iVar25._M_current)->texcoord_index = ind[0].v_idx;
              (iVar25._M_current)->vertex_index = auStack_a8._0_4_;
              (iVar25._M_current)->normal_index = auStack_a8._4_4_;
              ppiVar2 = &(shape->points).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppiVar2 = *ppiVar2 + 1;
            }
            uVar24 = uVar24 + 1;
            p_Var28 = (prim_group->pointsGroup).
                      super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pvVar15 = p_Var28[uVar21].vertex_indices.
                      super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar23 = lVar23 + 0xc;
          } while (uVar24 < (ulong)(((long)p_Var28[uVar21].vertex_indices.
                                           super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pvVar15 >> 2) * -0x5555555555555555));
          p_Var18 = (prim_group->pointsGroup).
                    super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 < (ulong)(((long)p_Var18 - (long)p_Var28 >> 3) * -0x5555555555555555));
      bVar10 = true;
    }
  }
  return bVar10;
}

Assistant:

static bool exportGroupsToShape(shape_t *shape, const PrimGroup &prim_group,
                                const std::vector<tag_t> &tags,
                                const int material_id, const std::string &name,
                                bool triangulate,
                                const std::vector<real_t> &v) {
  if (prim_group.IsEmpty()) {
    return false;
  }

  shape->name = name;

  // polygon
  if (!prim_group.faceGroup.empty()) {
    // Flatten vertices and indices
    for (size_t i = 0; i < prim_group.faceGroup.size(); i++) {
      const face_t &face = prim_group.faceGroup[i];

      size_t npolys = face.vertex_indices.size();

      if (npolys < 3) {
        // Face must have 3+ vertices.
        continue;
      }

      vertex_index_t i0 = face.vertex_indices[0];
      vertex_index_t i1(-1);
      vertex_index_t i2 = face.vertex_indices[1];

      if (triangulate) {
        // find the two axes to work in
        size_t axes[2] = {1, 2};
        for (size_t k = 0; k < npolys; ++k) {
          i0 = face.vertex_indices[(k + 0) % npolys];
          i1 = face.vertex_indices[(k + 1) % npolys];
          i2 = face.vertex_indices[(k + 2) % npolys];
          size_t vi0 = size_t(i0.v_idx);
          size_t vi1 = size_t(i1.v_idx);
          size_t vi2 = size_t(i2.v_idx);

          if (((3 * vi0 + 2) >= v.size()) || ((3 * vi1 + 2) >= v.size()) ||
              ((3 * vi2 + 2) >= v.size())) {
            // Invalid triangle.
            // FIXME(syoyo): Is it ok to simply skip this invalid triangle?
            continue;
          }
          real_t v0x = v[vi0 * 3 + 0];
          real_t v0y = v[vi0 * 3 + 1];
          real_t v0z = v[vi0 * 3 + 2];
          real_t v1x = v[vi1 * 3 + 0];
          real_t v1y = v[vi1 * 3 + 1];
          real_t v1z = v[vi1 * 3 + 2];
          real_t v2x = v[vi2 * 3 + 0];
          real_t v2y = v[vi2 * 3 + 1];
          real_t v2z = v[vi2 * 3 + 2];
          real_t e0x = v1x - v0x;
          real_t e0y = v1y - v0y;
          real_t e0z = v1z - v0z;
          real_t e1x = v2x - v1x;
          real_t e1y = v2y - v1y;
          real_t e1z = v2z - v1z;
          real_t cx = std::fabs(e0y * e1z - e0z * e1y);
          real_t cy = std::fabs(e0z * e1x - e0x * e1z);
          real_t cz = std::fabs(e0x * e1y - e0y * e1x);
          const real_t epsilon = std::numeric_limits<real_t>::epsilon();
          if (cx > epsilon || cy > epsilon || cz > epsilon) {
            // found a corner
            if (cx > cy && cx > cz) {
            } else {
              axes[0] = 0;
              if (cz > cx && cz > cy) axes[1] = 1;
            }
            break;
          }
        }

        real_t area = 0;
        for (size_t k = 0; k < npolys; ++k) {
          i0 = face.vertex_indices[(k + 0) % npolys];
          i1 = face.vertex_indices[(k + 1) % npolys];
          size_t vi0 = size_t(i0.v_idx);
          size_t vi1 = size_t(i1.v_idx);
          if (((vi0 * 3 + axes[0]) >= v.size()) ||
              ((vi0 * 3 + axes[1]) >= v.size()) ||
              ((vi1 * 3 + axes[0]) >= v.size()) ||
              ((vi1 * 3 + axes[1]) >= v.size())) {
            // Invalid index.
            continue;
          }
          real_t v0x = v[vi0 * 3 + axes[0]];
          real_t v0y = v[vi0 * 3 + axes[1]];
          real_t v1x = v[vi1 * 3 + axes[0]];
          real_t v1y = v[vi1 * 3 + axes[1]];
          area += (v0x * v1y - v0y * v1x) * static_cast<real_t>(0.5);
        }

        face_t remainingFace = face;  // copy
        size_t guess_vert = 0;
        vertex_index_t ind[3];
        real_t vx[3];
        real_t vy[3];

        // How many iterations can we do without decreasing the remaining
        // vertices.
        size_t remainingIterations = face.vertex_indices.size();
        size_t previousRemainingVertices = remainingFace.vertex_indices.size();

        while (remainingFace.vertex_indices.size() > 3 &&
               remainingIterations > 0) {
          npolys = remainingFace.vertex_indices.size();
          if (guess_vert >= npolys) {
            guess_vert -= npolys;
          }

          if (previousRemainingVertices != npolys) {
            // The number of remaining vertices decreased. Reset counters.
            previousRemainingVertices = npolys;
            remainingIterations = npolys;
          } else {
            // We didn't consume a vertex on previous iteration, reduce the
            // available iterations.
            remainingIterations--;
          }

          for (size_t k = 0; k < 3; k++) {
            ind[k] = remainingFace.vertex_indices[(guess_vert + k) % npolys];
            size_t vi = size_t(ind[k].v_idx);
            if (((vi * 3 + axes[0]) >= v.size()) ||
                ((vi * 3 + axes[1]) >= v.size())) {
              // ???
              vx[k] = static_cast<real_t>(0.0);
              vy[k] = static_cast<real_t>(0.0);
            } else {
              vx[k] = v[vi * 3 + axes[0]];
              vy[k] = v[vi * 3 + axes[1]];
            }
          }
          real_t e0x = vx[1] - vx[0];
          real_t e0y = vy[1] - vy[0];
          real_t e1x = vx[2] - vx[1];
          real_t e1y = vy[2] - vy[1];
          real_t cross = e0x * e1y - e0y * e1x;
          // if an internal angle
          if (cross * area < static_cast<real_t>(0.0)) {
            guess_vert += 1;
            continue;
          }

          // check all other verts in case they are inside this triangle
          bool overlap = false;
          for (size_t otherVert = 3; otherVert < npolys; ++otherVert) {
            size_t idx = (guess_vert + otherVert) % npolys;

            if (idx >= remainingFace.vertex_indices.size()) {
              // ???
              continue;
            }

            size_t ovi = size_t(remainingFace.vertex_indices[idx].v_idx);

            if (((ovi * 3 + axes[0]) >= v.size()) ||
                ((ovi * 3 + axes[1]) >= v.size())) {
              // ???
              continue;
            }
            real_t tx = v[ovi * 3 + axes[0]];
            real_t ty = v[ovi * 3 + axes[1]];
            if (pnpoly(3, vx, vy, tx, ty)) {
              overlap = true;
              break;
            }
          }

          if (overlap) {
            guess_vert += 1;
            continue;
          }

          // this triangle is an ear
          {
            index_t idx0, idx1, idx2;
            idx0.vertex_index = ind[0].v_idx;
            idx0.normal_index = ind[0].vn_idx;
            idx0.texcoord_index = ind[0].vt_idx;
            idx1.vertex_index = ind[1].v_idx;
            idx1.normal_index = ind[1].vn_idx;
            idx1.texcoord_index = ind[1].vt_idx;
            idx2.vertex_index = ind[2].v_idx;
            idx2.normal_index = ind[2].vn_idx;
            idx2.texcoord_index = ind[2].vt_idx;

            shape->mesh.indices.push_back(idx0);
            shape->mesh.indices.push_back(idx1);
            shape->mesh.indices.push_back(idx2);

            shape->mesh.num_face_vertices.push_back(3);
            shape->mesh.material_ids.push_back(material_id);
            shape->mesh.smoothing_group_ids.push_back(face.smoothing_group_id);
          }

          // remove v1 from the list
          size_t removed_vert_index = (guess_vert + 1) % npolys;
          while (removed_vert_index + 1 < npolys) {
            remainingFace.vertex_indices[removed_vert_index] =
                remainingFace.vertex_indices[removed_vert_index + 1];
            removed_vert_index += 1;
          }
          remainingFace.vertex_indices.pop_back();
        }

        if (remainingFace.vertex_indices.size() == 3) {
          i0 = remainingFace.vertex_indices[0];
          i1 = remainingFace.vertex_indices[1];
          i2 = remainingFace.vertex_indices[2];
          {
            index_t idx0, idx1, idx2;
            idx0.vertex_index = i0.v_idx;
            idx0.normal_index = i0.vn_idx;
            idx0.texcoord_index = i0.vt_idx;
            idx1.vertex_index = i1.v_idx;
            idx1.normal_index = i1.vn_idx;
            idx1.texcoord_index = i1.vt_idx;
            idx2.vertex_index = i2.v_idx;
            idx2.normal_index = i2.vn_idx;
            idx2.texcoord_index = i2.vt_idx;

            shape->mesh.indices.push_back(idx0);
            shape->mesh.indices.push_back(idx1);
            shape->mesh.indices.push_back(idx2);

            shape->mesh.num_face_vertices.push_back(3);
            shape->mesh.material_ids.push_back(material_id);
            shape->mesh.smoothing_group_ids.push_back(face.smoothing_group_id);
          }
        }
      } else {
        for (size_t k = 0; k < npolys; k++) {
          index_t idx;
          idx.vertex_index = face.vertex_indices[k].v_idx;
          idx.normal_index = face.vertex_indices[k].vn_idx;
          idx.texcoord_index = face.vertex_indices[k].vt_idx;
          shape->mesh.indices.push_back(idx);
        }

        shape->mesh.num_face_vertices.push_back(
            static_cast<unsigned char>(npolys));
        shape->mesh.material_ids.push_back(material_id);  // per face
        shape->mesh.smoothing_group_ids.push_back(
            face.smoothing_group_id);  // per face
      }
    }

    shape->mesh.tags = tags;
  }

  // line
  if (!prim_group.lineGroup.empty()) {
    // Flatten indices
    for (size_t i = 0; i < prim_group.lineGroup.size(); i++) {
      for (size_t j = 0; j < prim_group.lineGroup[i].vertex_indices.size();
           j++) {
        const vertex_index_t &vi = prim_group.lineGroup[i].vertex_indices[j];

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        shape->lines.indices.push_back(idx);
      }

      shape->lines.num_line_vertices.push_back(
          int(prim_group.lineGroup[i].vertex_indices.size()));
    }
  }

  // points
  if (!prim_group.pointsGroup.empty()) {
    // Flatten & convert indices
    for (size_t i = 0; i < prim_group.pointsGroup.size(); i++) {
      for (size_t j = 0; j < prim_group.pointsGroup[i].vertex_indices.size();
           j++) {
        const vertex_index_t &vi = prim_group.pointsGroup[i].vertex_indices[j];

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        shape->points.indices.push_back(idx);
      }
    }
  }

  return true;
}